

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O3

void dtrmv(char uplo,char trans,char diag,int n,double *a,int lda,double *x,int incx)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  string local_78;
  ulong local_58;
  ulong local_50;
  int local_44;
  double *local_40;
  char local_31;
  
  local_58 = CONCAT44(in_register_0000000c,n);
  local_40 = a;
  bVar1 = lsame(uplo,'U');
  if (!bVar1) {
    bVar1 = lsame(uplo,'L');
    iVar4 = 1;
    if (!bVar1) goto LAB_00214981;
  }
  bVar1 = lsame(trans,'N');
  if ((!bVar1) && (bVar1 = lsame(trans,'T'), !bVar1)) {
    bVar1 = lsame(trans,'C');
    iVar4 = 2;
    if (!bVar1) goto LAB_00214981;
  }
  bVar1 = lsame(diag,'U');
  if (!bVar1) {
    bVar1 = lsame(diag,'N');
    iVar4 = 3;
    if (!bVar1) goto LAB_00214981;
  }
  if ((int)local_58 < 0) {
    iVar4 = 4;
  }
  else {
    iVar3 = i4_max(1,(int)local_58);
    iVar4 = 6;
    if (iVar3 <= lda) {
      local_50 = (ulong)(uint)lda;
      if (incx != 0) {
        iVar4 = (int)local_58;
        if (iVar4 == 0) {
          return;
        }
        local_31 = lsame(diag,'N');
        local_44 = 0;
        if (incx < 1) {
          local_44 = (1 - iVar4) * incx;
        }
        bVar1 = lsame(trans,'N');
        bVar2 = lsame(uplo,'U');
        iVar4 = (int)local_50;
        if (!bVar1) {
          if (!bVar2) {
            local_58 = local_58 & 0xffffffff;
            if (incx == 1) {
              uVar9 = local_58;
              pdVar10 = x;
              pdVar8 = local_40;
              uVar13 = 0;
              do {
                dVar17 = x[uVar13];
                if (local_31 != '\0') {
                  dVar17 = dVar17 * local_40[(iVar4 + 1) * (int)uVar13];
                }
                uVar15 = uVar13 + 1;
                if (uVar15 < local_58) {
                  uVar16 = 1;
                  do {
                    dVar17 = dVar17 + pdVar8[uVar16] * pdVar10[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                x[uVar13] = dVar17;
                pdVar8 = pdVar8 + (long)iVar4 + 1;
                pdVar10 = pdVar10 + 1;
                uVar9 = uVar9 - 1;
                uVar13 = uVar15;
              } while (uVar15 != local_58);
              return;
            }
            lVar6 = (long)local_44;
            lVar11 = (long)incx;
            pdVar10 = x + lVar6 + lVar11;
            uVar13 = 0;
            pdVar8 = local_40;
            uVar9 = local_58;
            do {
              dVar17 = x[lVar6];
              if (local_31 != '\0') {
                dVar17 = dVar17 * local_40[(iVar4 + 1) * (int)uVar13];
              }
              uVar13 = uVar13 + 1;
              if (uVar13 < local_58) {
                uVar15 = 1;
                pdVar7 = pdVar10;
                do {
                  dVar17 = dVar17 + pdVar8[uVar15] * *pdVar7;
                  pdVar7 = pdVar7 + lVar11;
                  uVar15 = uVar15 + 1;
                } while (uVar9 != uVar15);
              }
              x[lVar6] = dVar17;
              lVar6 = lVar6 + lVar11;
              pdVar10 = pdVar10 + lVar11;
              pdVar8 = pdVar8 + (long)iVar4 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar13 != local_58);
            return;
          }
          if (incx == 1) {
            lVar6 = (long)(int)local_58;
            pdVar10 = local_40 + lVar6 + ((local_58 & 0xffffffff) - 1) * (long)iVar4 + -2;
            uVar9 = local_58 & 0xffffffff;
            do {
              lVar6 = lVar6 + -1;
              uVar13 = uVar9 - 1;
              dVar17 = x[uVar9 - 1];
              if (local_31 != '\0') {
                dVar17 = dVar17 * local_40[(iVar4 + 1) * (int)uVar13];
              }
              lVar11 = lVar6;
              pdVar8 = pdVar10;
              if (uVar9 < 2) {
                x[uVar13] = dVar17;
                return;
              }
              do {
                dVar17 = dVar17 + *pdVar8 * x[lVar11 + -1];
                lVar14 = lVar11 + -1;
                bVar1 = 0 < lVar11;
                lVar11 = lVar14;
                pdVar8 = pdVar8 + -1;
              } while (lVar14 != 0 && bVar1);
              x[uVar13] = dVar17;
              pdVar10 = pdVar10 + ~(long)iVar4;
              bVar1 = 1 < uVar9;
              uVar9 = uVar13;
            } while (bVar1);
            return;
          }
          iVar3 = ((int)local_58 + -1) * incx + local_44;
          uVar9 = local_58 & 0xffffffff;
          pdVar10 = local_40 + (uVar9 - 1) * (long)iVar4 + (uVar9 - 2);
          local_44 = ((int)local_58 + -2) * incx + local_44;
          while( true ) {
            dVar17 = x[iVar3];
            if (local_31 != '\0') {
              dVar17 = dVar17 * local_40[(iVar4 + 1) * (int)(uVar9 - 1)];
            }
            if (uVar9 < 2) break;
            lVar6 = 0;
            iVar12 = local_44;
            do {
              dVar17 = dVar17 + pdVar10[lVar6] * x[iVar12];
              lVar11 = uVar9 + lVar6;
              lVar6 = lVar6 + -1;
              iVar12 = iVar12 - incx;
            } while (1 < lVar11 - 1U);
            x[iVar3] = dVar17;
            iVar3 = iVar3 - incx;
            pdVar10 = pdVar10 + ~(long)iVar4;
            local_44 = local_44 - incx;
            bVar1 = uVar9 < 2;
            uVar9 = uVar9 - 1;
            if (bVar1) {
              return;
            }
          }
          x[iVar3] = dVar17;
          return;
        }
        if (!bVar2) {
          uVar5 = (int)local_58 - 1;
          if (incx == 1) {
            uVar13 = (local_58 & 0xffffffff) - 1;
            pdVar10 = local_40 + uVar13 * (long)iVar4;
            uVar9 = uVar13;
            do {
              dVar17 = x[uVar9];
              uVar15 = uVar13;
              uVar16 = (ulong)uVar5;
              if ((dVar17 != 0.0) || (NAN(dVar17))) {
                while ((long)uVar9 < (long)uVar16) {
                  x[uVar15] = pdVar10[uVar15] * dVar17 + x[uVar15];
                  uVar15 = uVar15 - 1;
                  uVar16 = uVar15;
                }
                if (local_31 != '\0') {
                  x[uVar9] = x[uVar9] * local_40[(iVar4 + 1) * (int)uVar9];
                }
              }
              pdVar10 = pdVar10 + -(long)iVar4;
              bVar1 = 0 < (long)uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar1);
            return;
          }
          local_44 = local_44 + uVar5 * incx;
          uVar13 = (local_58 & 0xffffffff) - 1;
          pdVar10 = local_40 + uVar13 * (long)iVar4;
          uVar9 = uVar13;
          iVar3 = local_44;
          do {
            dVar17 = x[iVar3];
            iVar12 = local_44;
            uVar15 = uVar13;
            uVar16 = (ulong)uVar5;
            if ((dVar17 != 0.0) || (NAN(dVar17))) {
              while ((long)uVar9 < (long)uVar16) {
                x[iVar12] = pdVar10[uVar15] * dVar17 + x[iVar12];
                uVar15 = uVar15 - 1;
                iVar12 = iVar12 - incx;
                uVar16 = uVar15;
              }
              if (local_31 != '\0') {
                x[iVar3] = x[iVar3] * local_40[(iVar4 + 1) * (int)uVar9];
              }
            }
            iVar3 = iVar3 - incx;
            pdVar10 = pdVar10 + -(long)iVar4;
            bVar1 = 0 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar1);
          return;
        }
        if (incx == 1) {
          uVar9 = 0;
          pdVar10 = local_40;
          do {
            dVar17 = x[uVar9];
            if ((dVar17 != 0.0) || (NAN(dVar17))) {
              if (uVar9 != 0) {
                uVar13 = 0;
                do {
                  x[uVar13] = pdVar10[uVar13] * dVar17 + x[uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar9 != uVar13);
              }
              if (local_31 != '\0') {
                x[uVar9] = x[uVar9] * local_40[(iVar4 + 1) * (int)uVar9];
              }
            }
            uVar9 = uVar9 + 1;
            pdVar10 = pdVar10 + iVar4;
          } while (uVar9 != (local_58 & 0xffffffff));
          return;
        }
        lVar6 = (long)local_44;
        pdVar10 = x + lVar6;
        uVar9 = 0;
        pdVar8 = local_40;
        do {
          dVar17 = x[lVar6];
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            if (uVar9 != 0) {
              uVar13 = 0;
              pdVar7 = pdVar10;
              do {
                *pdVar7 = pdVar8[uVar13] * dVar17 + *pdVar7;
                uVar13 = uVar13 + 1;
                pdVar7 = pdVar7 + incx;
              } while (uVar9 != uVar13);
            }
            if (local_31 != '\0') {
              x[lVar6] = x[lVar6] * local_40[(iVar4 + 1) * (int)uVar9];
            }
          }
          lVar6 = lVar6 + incx;
          uVar9 = uVar9 + 1;
          pdVar8 = pdVar8 + iVar4;
        } while (uVar9 != (local_58 & 0xffffffff));
        return;
      }
      iVar4 = 8;
    }
  }
LAB_00214981:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"DTRMV","");
  xerbla(&local_78,iVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dtrmv ( char uplo, char trans, char diag, int n, double a[], int lda, 
  double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMV computes x: = A*x or x = A'*x for a triangular matrix A.
//
//  Discussion:
//
//    DTRMV performs one of the matrix-vector operations
//
//      x := A*x,   or   x := A'*x,
//
//    where x is an n element vector and  A is an n by n unit, or non-unit,
//    upper or lower triangular matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char UPLO, specifies whether the matrix is an upper or
//    lower triangular matrix as follows:
//    'u' or 'U': A is an upper triangular matrix.
//    'l' or 'L': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the operation to be performed as
//    follows:
//    'n' or 'N': x := A*x.
//    't' or 'T': x := A'*x.
//    'c' or 'C': x := A'*x.
//
//    Input, char DIAG, specifies whether or not A is unit
//    triangular as follows:
//    'u' or 'U': A is assumed to be unit triangular.
//    'n' or 'N': A is not assumed to be unit triangular.
//
//    Input, int N, the order of the matrix A.
//    0 <= N.
//
//    Input, double A[LDA*N].
//    Before entry with  UPLO = 'u' or 'U', the leading n by n
//    upper triangular part of the array A must contain the upper
//    triangular matrix and the strictly lower triangular part of
//    A is not referenced.
//    Before entry with UPLO = 'l' or 'L', the leading n by n
//    lower triangular part of the array A must contain the lower
//    triangular matrix and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'u' or 'U', the diagonal elements of
//    A are not referenced either, but are assumed to be unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, N ) <= LDA.
//
//    Input/output, double X[1+(N-1)*abs( INCX)].
//    Before entry, the incremented array X must contain the n
//    element vector x. On exit, X is overwritten with the
//    tranformed vector x.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jx;
  int kx = 0;
  bool nounit;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if  ( ! lsame ( uplo, 'U' ) && ! lsame ( uplo, 'L' )  )
  {
    info = 1;
  }
  else if ( ! lsame ( trans, 'N' ) && ! lsame ( trans, 'T' ) && 
            ! lsame ( trans, 'C' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 3;
  }
  else if ( n < 0 )
  {
    info = 4;
  }
  else if ( lda < i4_max ( 1, n ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }

  if ( info != 0 )
  {
    xerbla ( "DTRMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 ) 
  {
    return;
  }

  nounit = lsame ( diag, 'N' );
//
//  Set up the start point in X if the increment is not unity. This
//  will be  ( N - 1 ) * INCX  too small for descending loops.
//
  if ( incx <= 0 )
  {
    kx = 0 - ( n - 1 ) * incx;
  }
  else if ( incx != 1 )
  {
    kx = 0;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( lsame ( trans, 'N' ) )
  {
//
//  Form x := A*x.
//
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = 0; i < j; i++ )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = 0; i < j; i++ )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix + incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx + incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = n - 1; j < i; i-- )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        kx = kx + ( n - 1 ) * incx;
        jx = kx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = n - 1; j < i; i-- )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix - incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx - incx;
        }
      }
    }
  }
//
//  Form x := A'*x.
//
  else
  {
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx + ( n - 1 ) * incx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            ix = ix - incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx - incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            ix = ix + incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx + incx;
        }
      }
    }
  }

  return;
}